

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O2

void __thiscall
burst::k_ary_search_set<int,_std::greater<void>_>::fill_counters
          (k_ary_search_set<int,_std::greater<void>_> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters)

{
  pointer puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  pointer puVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  unsigned_long uVar11;
  bool bVar12;
  
  sVar9 = branch->height;
  sVar2 = perfect_tree_size(this->m_arity,sVar9 - 2);
  sVar3 = perfect_tree_size(this->m_arity,sVar9 - 1);
  sVar9 = branch->size;
  sVar4 = perfect_tree_size(this->m_arity,branch->height - 1);
  uVar7 = branch->size + 1;
  if (this->m_arity <= uVar7) {
    uVar7 = this->m_arity;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(counters,uVar7);
  puVar5 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)puVar1 - (long)puVar5 >> 3;
  uVar7 = (sVar9 + sVar2) - sVar4;
  lVar8 = 0;
  sVar9 = sVar3;
  while( true ) {
    uVar10 = uVar7;
    if (sVar9 < uVar7) {
      uVar10 = sVar9;
    }
    bVar12 = lVar6 == 0;
    lVar6 = lVar6 + -1;
    if (bVar12) break;
    uVar11 = uVar10 + lVar8;
    lVar8 = lVar8 + 1;
    *puVar5 = uVar11;
    puVar5 = puVar5 + 1;
    sVar9 = sVar9 + sVar3;
    uVar7 = uVar7 + sVar2;
  }
  if (puVar1[-1] == branch->size) {
    return;
  }
  __assert_fail("counters.back() == branch.size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x197,
                "void burst::k_ary_search_set<int, std::greater<void>>::fill_counters(const k_ary_search_set_branch &, std::vector<std::size_t> &) [Value = int, Compare = std::greater<void>]"
               );
}

Assistant:

void
            fill_counters
            (
                const k_ary_search_set_branch & branch,
                std::vector<std::size_t> & counters
            )
        {
            const std::size_t max_subtree_height = branch.height - 1;
            const std::size_t min_subtree_elements =
                perfect_tree_size(m_arity, max_subtree_height - 1);
            const std::size_t max_subtree_elements =
                perfect_tree_size(m_arity, max_subtree_height);
            const std::size_t elements_in_last_row =
                branch.size - perfect_tree_size(m_arity, branch.height - 1);

            counters.resize(std::min(m_arity, branch.size + 1));
            for (std::size_t i = 0; i < counters.size(); ++i)
            {
                counters[i] = i + std::min
                (
                    (i + 1) * min_subtree_elements + elements_in_last_row,
                    (i + 1) * max_subtree_elements
                );
            }
            BOOST_ASSERT(counters.back() == branch.size);
        }